

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O2

void secp256k1_fe_impl_get_b32(uchar *r,secp256k1_fe *a)

{
  *r = *(uchar *)((long)a->n + 0x25);
  r[1] = *(uchar *)((long)a->n + 0x24);
  r[2] = *(uchar *)((long)a->n + 0x23);
  r[3] = *(uchar *)((long)a->n + 0x22);
  r[4] = *(uchar *)((long)a->n + 0x21);
  r[5] = (uchar)a->n[4];
  r[6] = (uchar)(a->n[3] >> 0x2c);
  r[7] = (uchar)(a->n[3] >> 0x24);
  r[8] = (uchar)(a->n[3] >> 0x1c);
  r[9] = (uchar)((uint)a->n[3] >> 0x14);
  r[10] = (uchar)((uint)a->n[3] >> 0xc);
  r[0xb] = (uchar)((uint)a->n[3] >> 4);
  r[0xc] = (byte)((int)a->n[3] << 4) | (byte)*(undefined2 *)((long)a->n + 0x16) & 0xf;
  r[0xd] = *(uchar *)((long)a->n + 0x15);
  r[0xe] = *(uchar *)((long)a->n + 0x14);
  r[0xf] = *(uchar *)((long)a->n + 0x13);
  r[0x10] = *(uchar *)((long)a->n + 0x12);
  r[0x11] = *(uchar *)((long)a->n + 0x11);
  r[0x12] = (uchar)a->n[2];
  r[0x13] = (uchar)(a->n[1] >> 0x2c);
  r[0x14] = (uchar)(a->n[1] >> 0x24);
  r[0x15] = (uchar)(a->n[1] >> 0x1c);
  r[0x16] = (uchar)((uint)a->n[1] >> 0x14);
  r[0x17] = (uchar)((uint)a->n[1] >> 0xc);
  r[0x18] = (uchar)((uint)a->n[1] >> 4);
  r[0x19] = (byte)((int)a->n[1] << 4) | (byte)*(undefined2 *)((long)a->n + 6) & 0xf;
  r[0x1a] = *(uchar *)((long)a->n + 5);
  r[0x1b] = *(uchar *)((long)a->n + 4);
  r[0x1c] = *(uchar *)((long)a->n + 3);
  r[0x1d] = *(uchar *)((long)a->n + 2);
  r[0x1e] = *(uchar *)((long)a->n + 1);
  r[0x1f] = (uchar)a->n[0];
  return;
}

Assistant:

static void secp256k1_fe_impl_get_b32(unsigned char *r, const secp256k1_fe *a) {
    r[0] = (a->n[4] >> 40) & 0xFF;
    r[1] = (a->n[4] >> 32) & 0xFF;
    r[2] = (a->n[4] >> 24) & 0xFF;
    r[3] = (a->n[4] >> 16) & 0xFF;
    r[4] = (a->n[4] >> 8) & 0xFF;
    r[5] = a->n[4] & 0xFF;
    r[6] = (a->n[3] >> 44) & 0xFF;
    r[7] = (a->n[3] >> 36) & 0xFF;
    r[8] = (a->n[3] >> 28) & 0xFF;
    r[9] = (a->n[3] >> 20) & 0xFF;
    r[10] = (a->n[3] >> 12) & 0xFF;
    r[11] = (a->n[3] >> 4) & 0xFF;
    r[12] = ((a->n[2] >> 48) & 0xF) | ((a->n[3] & 0xF) << 4);
    r[13] = (a->n[2] >> 40) & 0xFF;
    r[14] = (a->n[2] >> 32) & 0xFF;
    r[15] = (a->n[2] >> 24) & 0xFF;
    r[16] = (a->n[2] >> 16) & 0xFF;
    r[17] = (a->n[2] >> 8) & 0xFF;
    r[18] = a->n[2] & 0xFF;
    r[19] = (a->n[1] >> 44) & 0xFF;
    r[20] = (a->n[1] >> 36) & 0xFF;
    r[21] = (a->n[1] >> 28) & 0xFF;
    r[22] = (a->n[1] >> 20) & 0xFF;
    r[23] = (a->n[1] >> 12) & 0xFF;
    r[24] = (a->n[1] >> 4) & 0xFF;
    r[25] = ((a->n[0] >> 48) & 0xF) | ((a->n[1] & 0xF) << 4);
    r[26] = (a->n[0] >> 40) & 0xFF;
    r[27] = (a->n[0] >> 32) & 0xFF;
    r[28] = (a->n[0] >> 24) & 0xFF;
    r[29] = (a->n[0] >> 16) & 0xFF;
    r[30] = (a->n[0] >> 8) & 0xFF;
    r[31] = a->n[0] & 0xFF;
}